

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec3,int *ridx3,int *rn3,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps3)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp1;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp3;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_da8;
  int *local_d50;
  int *local_d48;
  int *local_d40;
  pointer local_d38;
  ulong local_d30;
  cpp_dec_float<100U,_int,_void> local_d28;
  int *local_cd8;
  ulong local_cd0;
  int *local_cc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cc0;
  cpp_dec_float<100U,_int,_void> local_cb8;
  cpp_dec_float<100U,_int,_void> local_c68;
  cpp_dec_float<100U,_int,_void> local_c18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b78;
  cpp_dec_float<100U,_int,_void> local_b28;
  cpp_dec_float<100U,_int,_void> local_ad8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_998;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_948;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_858;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_808;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_718;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_cb8.fpclass = cpp_dec_float_finite;
  local_cb8.prec_elem = 0x10;
  local_cb8.data._M_elems[0] = 0;
  local_cb8.data._M_elems[1] = 0;
  local_cb8.data._M_elems[2] = 0;
  local_cb8.data._M_elems[3] = 0;
  local_cb8.data._M_elems[4] = 0;
  local_cb8.data._M_elems[5] = 0;
  local_cb8.data._M_elems[6] = 0;
  local_cb8.data._M_elems[7] = 0;
  local_cb8.data._M_elems[8] = 0;
  local_cb8.data._M_elems[9] = 0;
  local_cb8.data._M_elems[10] = 0;
  local_cb8.data._M_elems[0xb] = 0;
  local_cb8.data._M_elems[0xc] = 0;
  local_cb8.data._M_elems[0xd] = 0;
  local_cb8.data._M_elems._56_5_ = 0;
  local_cb8.data._M_elems[0xf]._1_3_ = 0;
  local_cb8.exp = 0;
  local_cb8.neg = false;
  local_d28.fpclass = cpp_dec_float_finite;
  local_d28.prec_elem = 0x10;
  local_d28.data._M_elems[0] = 0;
  local_d28.data._M_elems[1] = 0;
  local_d28.data._M_elems[2] = 0;
  local_d28.data._M_elems[3] = 0;
  local_d28.data._M_elems[4] = 0;
  local_d28.data._M_elems[5] = 0;
  local_d28.data._M_elems[6] = 0;
  local_d28.data._M_elems[7] = 0;
  local_d28.data._M_elems[8] = 0;
  local_d28.data._M_elems[9] = 0;
  local_d28.data._M_elems[10] = 0;
  local_d28.data._M_elems[0xb] = 0;
  local_d28.data._M_elems[0xc] = 0;
  local_d28.data._M_elems[0xd] = 0;
  local_d28.data._M_elems._56_5_ = 0;
  local_d28.data._M_elems[0xf]._1_3_ = 0;
  local_d28.exp = 0;
  local_d28.neg = false;
  local_da8.fpclass = cpp_dec_float_finite;
  local_da8.prec_elem = 0x10;
  local_da8.data._M_elems[0] = 0;
  local_da8.data._M_elems[1] = 0;
  local_da8.data._M_elems[2] = 0;
  local_da8.data._M_elems[3] = 0;
  local_da8.data._M_elems[4] = 0;
  local_da8.data._M_elems[5] = 0;
  local_da8.data._M_elems[6] = 0;
  local_da8.data._M_elems[7] = 0;
  local_da8.data._M_elems[0xc] = 0;
  local_da8.data._M_elems[0xd] = 0;
  local_da8.data._M_elems._56_5_ = 0;
  local_da8.data._M_elems[0xf]._1_3_ = 0;
  local_da8.exp = 0;
  local_da8.neg = false;
  local_da8.data._M_elems[8] = 0;
  local_da8.data._M_elems[9] = 0;
  local_da8.data._M_elems[10] = 0;
  local_da8.data._M_elems[0xb] = 0;
  uVar3 = (this->l).firstUpdate;
  uVar8 = 0;
  local_cd0 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    local_cd0 = uVar8;
  }
  local_d38 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_d40 = (this->l).idx;
  local_cc8 = (this->l).row;
  local_cd8 = (this->l).start;
  local_d50 = ridx;
  local_d48 = rn;
  local_cc0 = eps;
  while (piVar11 = local_cd8, uVar8 != local_cd0) {
    iVar4 = local_cc8[uVar8];
    local_cb8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
    local_cb8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 4;
    local_cb8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_cb8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 8;
    local_cb8.data._M_elems._32_8_ = *(undefined8 *)puVar2;
    local_cb8.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 0xc;
    local_cb8.data._M_elems._48_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_cb8.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_cb8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_cb8.exp = vec[iVar4].m_backend.exp;
    local_cb8.neg = vec[iVar4].m_backend.neg;
    local_b78.m_backend.fpclass = vec[iVar4].m_backend.fpclass;
    local_b78.m_backend.prec_elem = vec[iVar4].m_backend.prec_elem;
    local_cb8.prec_elem = local_b78.m_backend.prec_elem;
    local_cb8.fpclass = local_b78.m_backend.fpclass;
    local_d28.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar4].m_backend.data._M_elems;
    local_d28.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec2[iVar4].m_backend.data._M_elems + 4;
    local_d28.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_d28.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec2[iVar4].m_backend.data._M_elems + 8;
    local_d28.data._M_elems._32_8_ = *(undefined8 *)puVar2;
    local_d28.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec2[iVar4].m_backend.data._M_elems + 0xc;
    local_d28.data._M_elems._48_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_d28.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_d28.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_d28.exp = vec2[iVar4].m_backend.exp;
    local_d28.neg = vec2[iVar4].m_backend.neg;
    local_d28.fpclass = vec2[iVar4].m_backend.fpclass;
    local_d28.prec_elem = vec2[iVar4].m_backend.prec_elem;
    local_da8.data._M_elems._0_8_ = *(undefined8 *)vec3[iVar4].m_backend.data._M_elems;
    local_da8.data._M_elems._8_8_ = *(undefined8 *)(vec3[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec3[iVar4].m_backend.data._M_elems + 4;
    local_da8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_da8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec3[iVar4].m_backend.data._M_elems + 8;
    local_da8.data._M_elems._32_8_ = *(undefined8 *)puVar2;
    local_da8.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec3[iVar4].m_backend.data._M_elems + 0xc;
    local_da8.data._M_elems._48_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_da8.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_da8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_da8.exp = vec3[iVar4].m_backend.exp;
    local_da8.neg = vec3[iVar4].m_backend.neg;
    local_da8.fpclass = vec3[iVar4].m_backend.fpclass;
    local_da8.prec_elem = vec3[iVar4].m_backend.prec_elem;
    local_b78.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
    local_b78.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 4;
    local_b78.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_b78.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 8;
    local_b78.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
    local_b78.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 0xc;
    local_b78.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
    local_b78.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
    local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_cc0->m_backend).data._M_elems;
    local_448.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 2);
    local_448.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 4);
    local_448.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 6);
    local_448.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 8);
    local_448.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 10);
    local_448.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 0xc);
    local_448.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((local_cc0->m_backend).data._M_elems + 0xe);
    local_448.m_backend.exp = (local_cc0->m_backend).exp;
    local_448.m_backend.neg = (local_cc0->m_backend).neg;
    local_448.m_backend.fpclass = (local_cc0->m_backend).fpclass;
    local_448.m_backend.prec_elem = (local_cc0->m_backend).prec_elem;
    local_b78.m_backend.exp = local_cb8.exp;
    local_b78.m_backend.neg = local_cb8.neg;
    bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_b78,&local_448);
    local_d30 = uVar8;
    if (bVar7) {
      iVar4 = piVar11[uVar8];
      piVar10 = local_d40 + iVar4;
      pcVar9 = &local_d38[iVar4].m_backend;
      local_498.m_backend.data._M_elems[0xf]._1_3_ = local_d28.data._M_elems[0xf]._1_3_;
      local_498.m_backend.data._M_elems._56_5_ = local_d28.data._M_elems._56_5_;
      local_498.m_backend.data._M_elems[0xc] = local_d28.data._M_elems[0xc];
      local_498.m_backend.data._M_elems[0xd] = local_d28.data._M_elems[0xd];
      local_498.m_backend.data._M_elems[8] = local_d28.data._M_elems[8];
      local_498.m_backend.data._M_elems[9] = local_d28.data._M_elems[9];
      local_498.m_backend.data._M_elems[10] = local_d28.data._M_elems[10];
      local_498.m_backend.data._M_elems[0xb] = local_d28.data._M_elems[0xb];
      local_498.m_backend.data._M_elems[4] = local_d28.data._M_elems[4];
      local_498.m_backend.data._M_elems[5] = local_d28.data._M_elems[5];
      local_498.m_backend.data._M_elems[6] = local_d28.data._M_elems[6];
      local_498.m_backend.data._M_elems[7] = local_d28.data._M_elems[7];
      local_498.m_backend.data._M_elems[0] = local_d28.data._M_elems[0];
      local_498.m_backend.data._M_elems[1] = local_d28.data._M_elems[1];
      local_498.m_backend.data._M_elems[2] = local_d28.data._M_elems[2];
      local_498.m_backend.data._M_elems[3] = local_d28.data._M_elems[3];
      local_498.m_backend.exp = local_d28.exp;
      local_498.m_backend.neg = local_d28.neg;
      local_498.m_backend.fpclass = local_d28.fpclass;
      local_498.m_backend.prec_elem = local_d28.prec_elem;
      local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_4e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_4e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_4e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_4e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_4e8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_4e8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_4e8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_4e8.m_backend.exp = (eps2->m_backend).exp;
      local_4e8.m_backend.neg = (eps2->m_backend).neg;
      local_4e8.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_4e8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_498,&local_4e8);
      if (bVar7) {
        local_538.m_backend.data._M_elems[0xf]._1_3_ = local_da8.data._M_elems[0xf]._1_3_;
        local_538.m_backend.data._M_elems._56_5_ = local_da8.data._M_elems._56_5_;
        local_538.m_backend.data._M_elems[0xc] = local_da8.data._M_elems[0xc];
        local_538.m_backend.data._M_elems[0xd] = local_da8.data._M_elems[0xd];
        local_538.m_backend.data._M_elems[8] = local_da8.data._M_elems[8];
        local_538.m_backend.data._M_elems[9] = local_da8.data._M_elems[9];
        local_538.m_backend.data._M_elems[10] = local_da8.data._M_elems[10];
        local_538.m_backend.data._M_elems[0xb] = local_da8.data._M_elems[0xb];
        local_538.m_backend.data._M_elems[4] = local_da8.data._M_elems[4];
        local_538.m_backend.data._M_elems[5] = local_da8.data._M_elems[5];
        local_538.m_backend.data._M_elems[6] = local_da8.data._M_elems[6];
        local_538.m_backend.data._M_elems[7] = local_da8.data._M_elems[7];
        local_538.m_backend.data._M_elems[0] = local_da8.data._M_elems[0];
        local_538.m_backend.data._M_elems[1] = local_da8.data._M_elems[1];
        local_538.m_backend.data._M_elems[2] = local_da8.data._M_elems[2];
        local_538.m_backend.data._M_elems[3] = local_da8.data._M_elems[3];
        local_538.m_backend.exp = local_da8.exp;
        local_538.m_backend.neg = local_da8.neg;
        local_538.m_backend.fpclass = local_da8.fpclass;
        local_538.m_backend.prec_elem = local_da8.prec_elem;
        local_588.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_588.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_588.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_588.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_588.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_588.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
        local_588.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
        local_588.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
        local_588.m_backend.exp = (eps3->m_backend).exp;
        local_588.m_backend.neg = (eps3->m_backend).neg;
        local_588.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_588.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_538,&local_588);
        iVar12 = piVar11[uVar8 + 1];
        if (bVar7) {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_88.fpclass = cpp_dec_float_finite;
            local_88.prec_elem = 0x10;
            local_88.data._M_elems[0] = 0;
            local_88.data._M_elems[1] = 0;
            local_88.data._M_elems[2] = 0;
            local_88.data._M_elems[3] = 0;
            local_88.data._M_elems[4] = 0;
            local_88.data._M_elems[5] = 0;
            local_88.data._M_elems[6] = 0;
            local_88.data._M_elems[7] = 0;
            local_88.data._M_elems[8] = 0;
            local_88.data._M_elems[9] = 0;
            local_88.data._M_elems[10] = 0;
            local_88.data._M_elems[0xb] = 0;
            local_88.data._M_elems[0xc] = 0;
            local_88.data._M_elems[0xd] = 0;
            local_88.data._M_elems._56_5_ = 0;
            local_88.data._M_elems[0xf]._1_3_ = 0;
            local_88.exp = 0;
            local_88.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_88,&local_cb8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_88,iVar5,vec + iVar5,local_d50,local_d48);
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_d8,&local_d28,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_d8,iVar5,vec2 + iVar5,ridx2,rn2);
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 0x10;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems[6] = 0;
            local_128.data._M_elems[7] = 0;
            local_128.data._M_elems[8] = 0;
            local_128.data._M_elems[9] = 0;
            local_128.data._M_elems[10] = 0;
            local_128.data._M_elems[0xb] = 0;
            local_128.data._M_elems[0xc] = 0;
            local_128.data._M_elems[0xd] = 0;
            local_128.data._M_elems._56_5_ = 0;
            local_128.data._M_elems[0xf]._1_3_ = 0;
            local_128.exp = 0;
            local_128.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_128,&local_da8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_128,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 0x10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems[6] = 0;
            local_178.data._M_elems[7] = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.data._M_elems[10] = 0;
            local_178.data._M_elems[0xb] = 0;
            local_178.data._M_elems[0xc] = 0;
            local_178.data._M_elems[0xd] = 0;
            local_178.data._M_elems._56_5_ = 0;
            local_178.data._M_elems[0xf]._1_3_ = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_178,&local_cb8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_178,iVar5,vec + iVar5,local_d50,local_d48);
            local_1c8.fpclass = cpp_dec_float_finite;
            local_1c8.prec_elem = 0x10;
            local_1c8.data._M_elems[0] = 0;
            local_1c8.data._M_elems[1] = 0;
            local_1c8.data._M_elems[2] = 0;
            local_1c8.data._M_elems[3] = 0;
            local_1c8.data._M_elems[4] = 0;
            local_1c8.data._M_elems[5] = 0;
            local_1c8.data._M_elems[6] = 0;
            local_1c8.data._M_elems[7] = 0;
            local_1c8.data._M_elems[8] = 0;
            local_1c8.data._M_elems[9] = 0;
            local_1c8.data._M_elems[10] = 0;
            local_1c8.data._M_elems[0xb] = 0;
            local_1c8.data._M_elems[0xc] = 0;
            local_1c8.data._M_elems[0xd] = 0;
            local_1c8.data._M_elems._56_5_ = 0;
            local_1c8.data._M_elems[0xf]._1_3_ = 0;
            local_1c8.exp = 0;
            local_1c8.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_1c8,&local_d28,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1c8,iVar5,vec2 + iVar5,ridx2,rn2);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
      else {
        local_5d8.m_backend.data._M_elems[0xf]._1_3_ = local_da8.data._M_elems[0xf]._1_3_;
        local_5d8.m_backend.data._M_elems._56_5_ = local_da8.data._M_elems._56_5_;
        local_5d8.m_backend.data._M_elems[0xc] = local_da8.data._M_elems[0xc];
        local_5d8.m_backend.data._M_elems[0xd] = local_da8.data._M_elems[0xd];
        local_5d8.m_backend.data._M_elems[8] = local_da8.data._M_elems[8];
        local_5d8.m_backend.data._M_elems[9] = local_da8.data._M_elems[9];
        local_5d8.m_backend.data._M_elems[10] = local_da8.data._M_elems[10];
        local_5d8.m_backend.data._M_elems[0xb] = local_da8.data._M_elems[0xb];
        local_5d8.m_backend.data._M_elems[4] = local_da8.data._M_elems[4];
        local_5d8.m_backend.data._M_elems[5] = local_da8.data._M_elems[5];
        local_5d8.m_backend.data._M_elems[6] = local_da8.data._M_elems[6];
        local_5d8.m_backend.data._M_elems[7] = local_da8.data._M_elems[7];
        local_5d8.m_backend.data._M_elems[0] = local_da8.data._M_elems[0];
        local_5d8.m_backend.data._M_elems[1] = local_da8.data._M_elems[1];
        local_5d8.m_backend.data._M_elems[2] = local_da8.data._M_elems[2];
        local_5d8.m_backend.data._M_elems[3] = local_da8.data._M_elems[3];
        local_5d8.m_backend.exp = local_da8.exp;
        local_5d8.m_backend.neg = local_da8.neg;
        local_5d8.m_backend.fpclass = local_da8.fpclass;
        local_5d8.m_backend.prec_elem = local_da8.prec_elem;
        local_628.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_628.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_628.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_628.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_628.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_628.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
        local_628.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
        local_628.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
        local_628.m_backend.exp = (eps3->m_backend).exp;
        local_628.m_backend.neg = (eps3->m_backend).neg;
        local_628.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_628.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_5d8,&local_628);
        iVar12 = piVar11[uVar8 + 1];
        if (bVar7) {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_218.fpclass = cpp_dec_float_finite;
            local_218.prec_elem = 0x10;
            local_218.data._M_elems[0] = 0;
            local_218.data._M_elems[1] = 0;
            local_218.data._M_elems[2] = 0;
            local_218.data._M_elems[3] = 0;
            local_218.data._M_elems[4] = 0;
            local_218.data._M_elems[5] = 0;
            local_218.data._M_elems[6] = 0;
            local_218.data._M_elems[7] = 0;
            local_218.data._M_elems[8] = 0;
            local_218.data._M_elems[9] = 0;
            local_218.data._M_elems[10] = 0;
            local_218.data._M_elems[0xb] = 0;
            local_218.data._M_elems[0xc] = 0;
            local_218.data._M_elems[0xd] = 0;
            local_218.data._M_elems._56_5_ = 0;
            local_218.data._M_elems[0xf]._1_3_ = 0;
            local_218.exp = 0;
            local_218.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_218,&local_cb8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_218,iVar5,vec + iVar5,local_d50,local_d48);
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 0x10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems[6] = 0;
            local_268.data._M_elems[7] = 0;
            local_268.data._M_elems[8] = 0;
            local_268.data._M_elems[9] = 0;
            local_268.data._M_elems[10] = 0;
            local_268.data._M_elems[0xb] = 0;
            local_268.data._M_elems[0xc] = 0;
            local_268.data._M_elems[0xd] = 0;
            local_268.data._M_elems._56_5_ = 0;
            local_268.data._M_elems[0xf]._1_3_ = 0;
            local_268.exp = 0;
            local_268.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_268,&local_da8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_268,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_2b8.fpclass = cpp_dec_float_finite;
            local_2b8.prec_elem = 0x10;
            local_2b8.data._M_elems[0] = 0;
            local_2b8.data._M_elems[1] = 0;
            local_2b8.data._M_elems[2] = 0;
            local_2b8.data._M_elems[3] = 0;
            local_2b8.data._M_elems[4] = 0;
            local_2b8.data._M_elems[5] = 0;
            local_2b8.data._M_elems[6] = 0;
            local_2b8.data._M_elems[7] = 0;
            local_2b8.data._M_elems[8] = 0;
            local_2b8.data._M_elems[9] = 0;
            local_2b8.data._M_elems[10] = 0;
            local_2b8.data._M_elems[0xb] = 0;
            local_2b8.data._M_elems[0xc] = 0;
            local_2b8.data._M_elems[0xd] = 0;
            local_2b8.data._M_elems._56_5_ = 0;
            local_2b8.data._M_elems[0xf]._1_3_ = 0;
            local_2b8.exp = 0;
            local_2b8.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_2b8,&local_cb8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_2b8,iVar5,vec + iVar5,local_d50,local_d48);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
    }
    else {
      local_678.m_backend.data._M_elems[0xf]._1_3_ = local_d28.data._M_elems[0xf]._1_3_;
      local_678.m_backend.data._M_elems._56_5_ = local_d28.data._M_elems._56_5_;
      local_678.m_backend.data._M_elems[0xc] = local_d28.data._M_elems[0xc];
      local_678.m_backend.data._M_elems[0xd] = local_d28.data._M_elems[0xd];
      local_678.m_backend.data._M_elems[8] = local_d28.data._M_elems[8];
      local_678.m_backend.data._M_elems[9] = local_d28.data._M_elems[9];
      local_678.m_backend.data._M_elems[10] = local_d28.data._M_elems[10];
      local_678.m_backend.data._M_elems[0xb] = local_d28.data._M_elems[0xb];
      local_678.m_backend.data._M_elems[4] = local_d28.data._M_elems[4];
      local_678.m_backend.data._M_elems[5] = local_d28.data._M_elems[5];
      local_678.m_backend.data._M_elems[6] = local_d28.data._M_elems[6];
      local_678.m_backend.data._M_elems[7] = local_d28.data._M_elems[7];
      local_678.m_backend.data._M_elems[0] = local_d28.data._M_elems[0];
      local_678.m_backend.data._M_elems[1] = local_d28.data._M_elems[1];
      local_678.m_backend.data._M_elems[2] = local_d28.data._M_elems[2];
      local_678.m_backend.data._M_elems[3] = local_d28.data._M_elems[3];
      local_678.m_backend.exp = local_d28.exp;
      local_678.m_backend.neg = local_d28.neg;
      local_678.m_backend.fpclass = local_d28.fpclass;
      local_678.m_backend.prec_elem = local_d28.prec_elem;
      local_6c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_6c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_6c8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_6c8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_6c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_6c8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_6c8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_6c8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_6c8.m_backend.exp = (eps2->m_backend).exp;
      local_6c8.m_backend.neg = (eps2->m_backend).neg;
      local_6c8.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_6c8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_678,&local_6c8);
      if (bVar7) {
        iVar4 = piVar11[uVar8];
        piVar10 = local_d40 + iVar4;
        pcVar9 = &local_d38[iVar4].m_backend;
        local_718.m_backend.data._M_elems[0xf]._1_3_ = local_da8.data._M_elems[0xf]._1_3_;
        local_718.m_backend.data._M_elems._56_5_ = local_da8.data._M_elems._56_5_;
        local_718.m_backend.data._M_elems[0xc] = local_da8.data._M_elems[0xc];
        local_718.m_backend.data._M_elems[0xd] = local_da8.data._M_elems[0xd];
        local_718.m_backend.data._M_elems[8] = local_da8.data._M_elems[8];
        local_718.m_backend.data._M_elems[9] = local_da8.data._M_elems[9];
        local_718.m_backend.data._M_elems[10] = local_da8.data._M_elems[10];
        local_718.m_backend.data._M_elems[0xb] = local_da8.data._M_elems[0xb];
        local_718.m_backend.data._M_elems[4] = local_da8.data._M_elems[4];
        local_718.m_backend.data._M_elems[5] = local_da8.data._M_elems[5];
        local_718.m_backend.data._M_elems[6] = local_da8.data._M_elems[6];
        local_718.m_backend.data._M_elems[7] = local_da8.data._M_elems[7];
        local_718.m_backend.data._M_elems[0] = local_da8.data._M_elems[0];
        local_718.m_backend.data._M_elems[1] = local_da8.data._M_elems[1];
        local_718.m_backend.data._M_elems[2] = local_da8.data._M_elems[2];
        local_718.m_backend.data._M_elems[3] = local_da8.data._M_elems[3];
        local_718.m_backend.exp = local_da8.exp;
        local_718.m_backend.neg = local_da8.neg;
        local_718.m_backend.fpclass = local_da8.fpclass;
        local_718.m_backend.prec_elem = local_da8.prec_elem;
        local_768.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_768.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_768.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_768.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_768.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_768.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
        local_768.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
        local_768.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
        local_768.m_backend.exp = (eps3->m_backend).exp;
        local_768.m_backend.neg = (eps3->m_backend).neg;
        local_768.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_768.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_718,&local_768);
        iVar12 = piVar11[uVar8 + 1];
        if (bVar7) {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_308.fpclass = cpp_dec_float_finite;
            local_308.prec_elem = 0x10;
            local_308.data._M_elems[0] = 0;
            local_308.data._M_elems[1] = 0;
            local_308.data._M_elems[2] = 0;
            local_308.data._M_elems[3] = 0;
            local_308.data._M_elems[4] = 0;
            local_308.data._M_elems[5] = 0;
            local_308.data._M_elems[6] = 0;
            local_308.data._M_elems[7] = 0;
            local_308.data._M_elems[8] = 0;
            local_308.data._M_elems[9] = 0;
            local_308.data._M_elems[10] = 0;
            local_308.data._M_elems[0xb] = 0;
            local_308.data._M_elems[0xc] = 0;
            local_308.data._M_elems[0xd] = 0;
            local_308.data._M_elems._56_5_ = 0;
            local_308.data._M_elems[0xf]._1_3_ = 0;
            local_308.exp = 0;
            local_308.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_308,&local_d28,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_308,iVar5,vec2 + iVar5,ridx2,rn2);
            local_358.fpclass = cpp_dec_float_finite;
            local_358.prec_elem = 0x10;
            local_358.data._M_elems[0] = 0;
            local_358.data._M_elems[1] = 0;
            local_358.data._M_elems[2] = 0;
            local_358.data._M_elems[3] = 0;
            local_358.data._M_elems[4] = 0;
            local_358.data._M_elems[5] = 0;
            local_358.data._M_elems[6] = 0;
            local_358.data._M_elems[7] = 0;
            local_358.data._M_elems[8] = 0;
            local_358.data._M_elems[9] = 0;
            local_358.data._M_elems[10] = 0;
            local_358.data._M_elems[0xb] = 0;
            local_358.data._M_elems[0xc] = 0;
            local_358.data._M_elems[0xd] = 0;
            local_358.data._M_elems._56_5_ = 0;
            local_358.data._M_elems[0xf]._1_3_ = 0;
            local_358.exp = 0;
            local_358.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_358,&local_da8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_358,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_3a8.fpclass = cpp_dec_float_finite;
            local_3a8.prec_elem = 0x10;
            local_3a8.data._M_elems[0] = 0;
            local_3a8.data._M_elems[1] = 0;
            local_3a8.data._M_elems[2] = 0;
            local_3a8.data._M_elems[3] = 0;
            local_3a8.data._M_elems[4] = 0;
            local_3a8.data._M_elems[5] = 0;
            local_3a8.data._M_elems[6] = 0;
            local_3a8.data._M_elems[7] = 0;
            local_3a8.data._M_elems[8] = 0;
            local_3a8.data._M_elems[9] = 0;
            local_3a8.data._M_elems[10] = 0;
            local_3a8.data._M_elems[0xb] = 0;
            local_3a8.data._M_elems[0xc] = 0;
            local_3a8.data._M_elems[0xd] = 0;
            local_3a8.data._M_elems._56_5_ = 0;
            local_3a8.data._M_elems[0xf]._1_3_ = 0;
            local_3a8.exp = 0;
            local_3a8.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_3a8,&local_d28,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3a8,iVar5,vec2 + iVar5,ridx2,rn2);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
      else {
        local_7b8.m_backend.data._M_elems[0xf]._1_3_ = local_da8.data._M_elems[0xf]._1_3_;
        local_7b8.m_backend.data._M_elems._56_5_ = local_da8.data._M_elems._56_5_;
        local_7b8.m_backend.data._M_elems[0xc] = local_da8.data._M_elems[0xc];
        local_7b8.m_backend.data._M_elems[0xd] = local_da8.data._M_elems[0xd];
        local_7b8.m_backend.data._M_elems[8] = local_da8.data._M_elems[8];
        local_7b8.m_backend.data._M_elems[9] = local_da8.data._M_elems[9];
        local_7b8.m_backend.data._M_elems[10] = local_da8.data._M_elems[10];
        local_7b8.m_backend.data._M_elems[0xb] = local_da8.data._M_elems[0xb];
        local_7b8.m_backend.data._M_elems[4] = local_da8.data._M_elems[4];
        local_7b8.m_backend.data._M_elems[5] = local_da8.data._M_elems[5];
        local_7b8.m_backend.data._M_elems[6] = local_da8.data._M_elems[6];
        local_7b8.m_backend.data._M_elems[7] = local_da8.data._M_elems[7];
        local_7b8.m_backend.data._M_elems[0] = local_da8.data._M_elems[0];
        local_7b8.m_backend.data._M_elems[1] = local_da8.data._M_elems[1];
        local_7b8.m_backend.data._M_elems[2] = local_da8.data._M_elems[2];
        local_7b8.m_backend.data._M_elems[3] = local_da8.data._M_elems[3];
        local_7b8.m_backend.exp = local_da8.exp;
        local_7b8.m_backend.neg = local_da8.neg;
        local_7b8.m_backend.fpclass = local_da8.fpclass;
        local_7b8.m_backend.prec_elem = local_da8.prec_elem;
        local_808.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_808.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_808.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_808.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_808.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_808.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
        local_808.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
        local_808.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
        local_808.m_backend.exp = (eps3->m_backend).exp;
        local_808.m_backend.neg = (eps3->m_backend).neg;
        local_808.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_808.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_7b8,&local_808);
        if (bVar7) {
          iVar4 = local_cd8[local_d30];
          piVar11 = local_d40 + iVar4;
          pcVar9 = &local_d38[iVar4].m_backend;
          for (iVar12 = local_cd8[local_d30 + 1]; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar11;
            piVar11 = piVar11 + 1;
            local_3f8.fpclass = cpp_dec_float_finite;
            local_3f8.prec_elem = 0x10;
            local_3f8.data._M_elems[0] = 0;
            local_3f8.data._M_elems[1] = 0;
            local_3f8.data._M_elems[2] = 0;
            local_3f8.data._M_elems[3] = 0;
            local_3f8.data._M_elems[4] = 0;
            local_3f8.data._M_elems[5] = 0;
            local_3f8.data._M_elems[6] = 0;
            local_3f8.data._M_elems[7] = 0;
            local_3f8.data._M_elems[8] = 0;
            local_3f8.data._M_elems[9] = 0;
            local_3f8.data._M_elems[10] = 0;
            local_3f8.data._M_elems[0xb] = 0;
            local_3f8.data._M_elems[0xc] = 0;
            local_3f8.data._M_elems[0xd] = 0;
            local_3f8.data._M_elems._56_5_ = 0;
            local_3f8.data._M_elems[0xf]._1_3_ = 0;
            local_3f8.exp = 0;
            local_3f8.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_3f8,&local_da8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_3f8,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
    }
    uVar8 = local_d30 + 1;
  }
  if ((this->l).updateType != 0) {
    local_d30 = (ulong)(this->l).firstUnused;
    uVar8 = local_cd0;
    while ((long)uVar8 < (long)local_d30) {
      iVar4 = piVar11[uVar8];
      piVar10 = local_d40 + iVar4;
      pcVar9 = &local_d38[iVar4].m_backend;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_c18);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_ad8);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_b28);
      uVar1 = uVar8 + 1;
      local_cd0 = uVar8;
      for (iVar12 = piVar11[uVar8 + 1]; iVar4 < iVar12; iVar12 = iVar12 + -1) {
        local_c68.fpclass = cpp_dec_float_finite;
        local_c68.prec_elem = 0x10;
        local_c68.data._M_elems[0] = 0;
        local_c68.data._M_elems[1] = 0;
        local_c68.data._M_elems[2] = 0;
        local_c68.data._M_elems[3] = 0;
        local_c68.data._M_elems[4] = 0;
        local_c68.data._M_elems[5] = 0;
        local_c68.data._M_elems[6] = 0;
        local_c68.data._M_elems[7] = 0;
        local_c68.data._M_elems[8] = 0;
        local_c68.data._M_elems[9] = 0;
        local_c68.data._M_elems[10] = 0;
        local_c68.data._M_elems[0xb] = 0;
        local_c68.data._M_elems[0xc] = 0;
        local_c68.data._M_elems[0xd] = 0;
        local_c68.data._M_elems._56_5_ = 0;
        local_c68.data._M_elems[0xf]._1_3_ = 0;
        local_c68.exp = 0;
        local_c68.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_c68,&vec[*piVar10].m_backend,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_c18,&local_c68);
        local_c68.fpclass = cpp_dec_float_finite;
        local_c68.prec_elem = 0x10;
        local_c68.data._M_elems[0] = 0;
        local_c68.data._M_elems[1] = 0;
        local_c68.data._M_elems[2] = 0;
        local_c68.data._M_elems[3] = 0;
        local_c68.data._M_elems[4] = 0;
        local_c68.data._M_elems[5] = 0;
        local_c68.data._M_elems[6] = 0;
        local_c68.data._M_elems[7] = 0;
        local_c68.data._M_elems[8] = 0;
        local_c68.data._M_elems[9] = 0;
        local_c68.data._M_elems[10] = 0;
        local_c68.data._M_elems[0xb] = 0;
        local_c68.data._M_elems[0xc] = 0;
        local_c68.data._M_elems[0xd] = 0;
        local_c68.data._M_elems._56_5_ = 0;
        local_c68.data._M_elems[0xf]._1_3_ = 0;
        local_c68.exp = 0;
        local_c68.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_c68,&vec2[*piVar10].m_backend,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_ad8,&local_c68);
        iVar5 = *piVar10;
        piVar10 = piVar10 + 1;
        local_c68.fpclass = cpp_dec_float_finite;
        local_c68.prec_elem = 0x10;
        local_c68.data._M_elems[0] = 0;
        local_c68.data._M_elems[1] = 0;
        local_c68.data._M_elems[2] = 0;
        local_c68.data._M_elems[3] = 0;
        local_c68.data._M_elems[4] = 0;
        local_c68.data._M_elems[5] = 0;
        local_c68.data._M_elems[6] = 0;
        local_c68.data._M_elems[7] = 0;
        local_c68.data._M_elems[8] = 0;
        local_c68.data._M_elems[9] = 0;
        local_c68.data._M_elems[10] = 0;
        local_c68.data._M_elems[0xb] = 0;
        local_c68.data._M_elems[0xc] = 0;
        local_c68.data._M_elems[0xd] = 0;
        local_c68.data._M_elems._56_5_ = 0;
        local_c68.data._M_elems[0xf]._1_3_ = 0;
        local_c68.exp = 0;
        local_c68.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_c68,&vec3[iVar5].m_backend,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_b28,&local_c68);
        pcVar9 = pcVar9 + 1;
      }
      local_cb8.data._M_elems[0xc] = local_c18.data._M_elems[0xc];
      local_cb8.data._M_elems[0xd] = local_c18.data._M_elems[0xd];
      local_cb8.data._M_elems._56_5_ = local_c18.data._M_elems._56_5_;
      local_cb8.data._M_elems[0xf]._1_3_ = local_c18.data._M_elems[0xf]._1_3_;
      local_cb8.data._M_elems[8] = local_c18.data._M_elems[8];
      local_cb8.data._M_elems[9] = local_c18.data._M_elems[9];
      local_cb8.data._M_elems[10] = local_c18.data._M_elems[10];
      local_cb8.data._M_elems[0xb] = local_c18.data._M_elems[0xb];
      local_cb8.data._M_elems[4] = local_c18.data._M_elems[4];
      local_cb8.data._M_elems[5] = local_c18.data._M_elems[5];
      local_cb8.data._M_elems[6] = local_c18.data._M_elems[6];
      local_cb8.data._M_elems[7] = local_c18.data._M_elems[7];
      local_cb8.data._M_elems[0] = local_c18.data._M_elems[0];
      local_cb8.data._M_elems[1] = local_c18.data._M_elems[1];
      local_cb8.data._M_elems[2] = local_c18.data._M_elems[2];
      local_cb8.data._M_elems[3] = local_c18.data._M_elems[3];
      local_cb8.exp = local_c18.exp;
      local_cb8.neg = local_c18.neg;
      local_cb8.prec_elem = local_c18.prec_elem;
      local_cb8.fpclass = local_c18.fpclass;
      local_d28.data._M_elems[0] = local_ad8.data._M_elems[0];
      local_d28.data._M_elems[1] = local_ad8.data._M_elems[1];
      local_d28.data._M_elems[2] = local_ad8.data._M_elems[2];
      local_d28.data._M_elems[3] = local_ad8.data._M_elems[3];
      local_d28.data._M_elems[4] = local_ad8.data._M_elems[4];
      local_d28.data._M_elems[5] = local_ad8.data._M_elems[5];
      local_d28.data._M_elems[6] = local_ad8.data._M_elems[6];
      local_d28.data._M_elems[7] = local_ad8.data._M_elems[7];
      local_d28.data._M_elems[8] = local_ad8.data._M_elems[8];
      local_d28.data._M_elems[9] = local_ad8.data._M_elems[9];
      local_d28.data._M_elems[10] = local_ad8.data._M_elems[10];
      local_d28.data._M_elems[0xb] = local_ad8.data._M_elems[0xb];
      local_d28.data._M_elems[0xc] = local_ad8.data._M_elems[0xc];
      local_d28.data._M_elems[0xd] = local_ad8.data._M_elems[0xd];
      local_d28.data._M_elems._56_5_ = local_ad8.data._M_elems._56_5_;
      local_d28.data._M_elems[0xf]._1_3_ = local_ad8.data._M_elems[0xf]._1_3_;
      local_d28.exp = local_ad8.exp;
      local_d28.neg = local_ad8.neg;
      local_d28.fpclass = local_ad8.fpclass;
      local_d28.prec_elem = local_ad8.prec_elem;
      local_da8.data._M_elems[0] = local_b28.data._M_elems[0];
      local_da8.data._M_elems[1] = local_b28.data._M_elems[1];
      local_da8.data._M_elems[2] = local_b28.data._M_elems[2];
      local_da8.data._M_elems[3] = local_b28.data._M_elems[3];
      local_da8.data._M_elems[4] = local_b28.data._M_elems[4];
      local_da8.data._M_elems[5] = local_b28.data._M_elems[5];
      local_da8.data._M_elems[6] = local_b28.data._M_elems[6];
      local_da8.data._M_elems[7] = local_b28.data._M_elems[7];
      local_da8.data._M_elems[8] = local_b28.data._M_elems[8];
      local_da8.data._M_elems[9] = local_b28.data._M_elems[9];
      local_da8.data._M_elems[10] = local_b28.data._M_elems[10];
      local_da8.data._M_elems[0xb] = local_b28.data._M_elems[0xb];
      local_da8.data._M_elems[0xc] = local_b28.data._M_elems[0xc];
      local_da8.data._M_elems[0xd] = local_b28.data._M_elems[0xd];
      local_da8.data._M_elems._56_5_ = local_b28.data._M_elems._56_5_;
      local_da8.data._M_elems[0xf]._1_3_ = local_b28.data._M_elems[0xf]._1_3_;
      local_da8.exp = local_b28.exp;
      local_da8.neg = local_b28.neg;
      local_da8.fpclass = local_b28.fpclass;
      local_da8.prec_elem = local_b28.prec_elem;
      iVar4 = local_cc8[local_cd0];
      local_bc8.m_backend.data._M_elems[0xc] = local_c18.data._M_elems[0xc];
      local_bc8.m_backend.data._M_elems[0xd] = local_c18.data._M_elems[0xd];
      local_bc8.m_backend.data._M_elems[0xe] = local_c18.data._M_elems[0xe];
      local_bc8.m_backend.data._M_elems[0xf] = local_c18.data._M_elems[0xf];
      local_bc8.m_backend.data._M_elems[8] = local_c18.data._M_elems[8];
      local_bc8.m_backend.data._M_elems[9] = local_c18.data._M_elems[9];
      local_bc8.m_backend.data._M_elems[10] = local_c18.data._M_elems[10];
      local_bc8.m_backend.data._M_elems[0xb] = local_c18.data._M_elems[0xb];
      local_bc8.m_backend.data._M_elems[4] = local_c18.data._M_elems[4];
      local_bc8.m_backend.data._M_elems[5] = local_c18.data._M_elems[5];
      local_bc8.m_backend.data._M_elems[6] = local_c18.data._M_elems[6];
      local_bc8.m_backend.data._M_elems[7] = local_c18.data._M_elems[7];
      local_bc8.m_backend.data._M_elems[0] = local_c18.data._M_elems[0];
      local_bc8.m_backend.data._M_elems[1] = local_c18.data._M_elems[1];
      local_bc8.m_backend.data._M_elems[2] = local_c18.data._M_elems[2];
      local_bc8.m_backend.data._M_elems[3] = local_c18.data._M_elems[3];
      local_bc8.m_backend.exp = local_c18.exp;
      local_bc8.m_backend.neg = local_c18.neg;
      local_bc8.m_backend.fpclass = local_c18.fpclass;
      local_bc8.m_backend.prec_elem = local_c18.prec_elem;
      local_858.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_cc0->m_backend).data._M_elems;
      local_858.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 2);
      local_858.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 4);
      local_858.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 6);
      local_858.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 8);
      local_858.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 10);
      local_858.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 0xc);
      local_858.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_cc0->m_backend).data._M_elems + 0xe);
      local_858.m_backend.exp = (local_cc0->m_backend).exp;
      local_858.m_backend.neg = (local_cc0->m_backend).neg;
      local_858.m_backend.fpclass = (local_cc0->m_backend).fpclass;
      local_858.m_backend.prec_elem = (local_cc0->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_bc8,&local_858);
      if (bVar7) {
        local_8a8.m_backend.data._M_elems[0xf]._1_3_ = local_cb8.data._M_elems[0xf]._1_3_;
        local_8a8.m_backend.data._M_elems._56_5_ = local_cb8.data._M_elems._56_5_;
        local_8a8.m_backend.data._M_elems[0xc] = local_cb8.data._M_elems[0xc];
        local_8a8.m_backend.data._M_elems[0xd] = local_cb8.data._M_elems[0xd];
        local_8a8.m_backend.data._M_elems[8] = local_cb8.data._M_elems[8];
        local_8a8.m_backend.data._M_elems[9] = local_cb8.data._M_elems[9];
        local_8a8.m_backend.data._M_elems[10] = local_cb8.data._M_elems[10];
        local_8a8.m_backend.data._M_elems[0xb] = local_cb8.data._M_elems[0xb];
        local_8a8.m_backend.data._M_elems[4] = local_cb8.data._M_elems[4];
        local_8a8.m_backend.data._M_elems[5] = local_cb8.data._M_elems[5];
        local_8a8.m_backend.data._M_elems[6] = local_cb8.data._M_elems[6];
        local_8a8.m_backend.data._M_elems[7] = local_cb8.data._M_elems[7];
        local_8a8.m_backend.data._M_elems[0] = local_cb8.data._M_elems[0];
        local_8a8.m_backend.data._M_elems[1] = local_cb8.data._M_elems[1];
        local_8a8.m_backend.data._M_elems[2] = local_cb8.data._M_elems[2];
        local_8a8.m_backend.data._M_elems[3] = local_cb8.data._M_elems[3];
        local_8a8.m_backend.exp = local_cb8.exp;
        local_8a8.m_backend.neg = local_cb8.neg;
        local_8a8.m_backend.fpclass = local_cb8.fpclass;
        local_8a8.m_backend.prec_elem = local_cb8.prec_elem;
        updateSolutionVectorLright(this,&local_8a8,iVar4,vec + iVar4,local_d50,local_d48);
      }
      local_8f8.m_backend.data._M_elems[0xf]._1_3_ = local_d28.data._M_elems[0xf]._1_3_;
      local_8f8.m_backend.data._M_elems._56_5_ = local_d28.data._M_elems._56_5_;
      local_8f8.m_backend.data._M_elems[0xc] = local_d28.data._M_elems[0xc];
      local_8f8.m_backend.data._M_elems[0xd] = local_d28.data._M_elems[0xd];
      local_8f8.m_backend.data._M_elems[8] = local_d28.data._M_elems[8];
      local_8f8.m_backend.data._M_elems[9] = local_d28.data._M_elems[9];
      local_8f8.m_backend.data._M_elems[10] = local_d28.data._M_elems[10];
      local_8f8.m_backend.data._M_elems[0xb] = local_d28.data._M_elems[0xb];
      local_8f8.m_backend.data._M_elems[4] = local_d28.data._M_elems[4];
      local_8f8.m_backend.data._M_elems[5] = local_d28.data._M_elems[5];
      local_8f8.m_backend.data._M_elems[6] = local_d28.data._M_elems[6];
      local_8f8.m_backend.data._M_elems[7] = local_d28.data._M_elems[7];
      local_8f8.m_backend.data._M_elems[0] = local_d28.data._M_elems[0];
      local_8f8.m_backend.data._M_elems[1] = local_d28.data._M_elems[1];
      local_8f8.m_backend.data._M_elems[2] = local_d28.data._M_elems[2];
      local_8f8.m_backend.data._M_elems[3] = local_d28.data._M_elems[3];
      local_8f8.m_backend.exp = local_d28.exp;
      local_8f8.m_backend.neg = local_d28.neg;
      local_8f8.m_backend.fpclass = local_d28.fpclass;
      local_8f8.m_backend.prec_elem = local_d28.prec_elem;
      local_948.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_948.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_948.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_948.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_948.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_948.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_948.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_948.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_948.m_backend.exp = (eps2->m_backend).exp;
      local_948.m_backend.neg = (eps2->m_backend).neg;
      local_948.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_948.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_8f8,&local_948);
      piVar11 = local_cd8;
      if (bVar7) {
        local_998.m_backend.data._M_elems[0xf]._1_3_ = local_d28.data._M_elems[0xf]._1_3_;
        local_998.m_backend.data._M_elems._56_5_ = local_d28.data._M_elems._56_5_;
        local_998.m_backend.data._M_elems[0xc] = local_d28.data._M_elems[0xc];
        local_998.m_backend.data._M_elems[0xd] = local_d28.data._M_elems[0xd];
        local_998.m_backend.data._M_elems[8] = local_d28.data._M_elems[8];
        local_998.m_backend.data._M_elems[9] = local_d28.data._M_elems[9];
        local_998.m_backend.data._M_elems[10] = local_d28.data._M_elems[10];
        local_998.m_backend.data._M_elems[0xb] = local_d28.data._M_elems[0xb];
        local_998.m_backend.data._M_elems[4] = local_d28.data._M_elems[4];
        local_998.m_backend.data._M_elems[5] = local_d28.data._M_elems[5];
        local_998.m_backend.data._M_elems[6] = local_d28.data._M_elems[6];
        local_998.m_backend.data._M_elems[7] = local_d28.data._M_elems[7];
        local_998.m_backend.data._M_elems[0] = local_d28.data._M_elems[0];
        local_998.m_backend.data._M_elems[1] = local_d28.data._M_elems[1];
        local_998.m_backend.data._M_elems[2] = local_d28.data._M_elems[2];
        local_998.m_backend.data._M_elems[3] = local_d28.data._M_elems[3];
        local_998.m_backend.exp = local_d28.exp;
        local_998.m_backend.neg = local_d28.neg;
        local_998.m_backend.fpclass = local_d28.fpclass;
        local_998.m_backend.prec_elem = local_d28.prec_elem;
        updateSolutionVectorLright(this,&local_998,iVar4,vec2 + iVar4,ridx2,rn2);
      }
      local_9e8.m_backend.data._M_elems[0xf]._1_3_ = local_da8.data._M_elems[0xf]._1_3_;
      local_9e8.m_backend.data._M_elems._56_5_ = local_da8.data._M_elems._56_5_;
      local_9e8.m_backend.data._M_elems[0xc] = local_da8.data._M_elems[0xc];
      local_9e8.m_backend.data._M_elems[0xd] = local_da8.data._M_elems[0xd];
      local_9e8.m_backend.data._M_elems[8] = local_da8.data._M_elems[8];
      local_9e8.m_backend.data._M_elems[9] = local_da8.data._M_elems[9];
      local_9e8.m_backend.data._M_elems[10] = local_da8.data._M_elems[10];
      local_9e8.m_backend.data._M_elems[0xb] = local_da8.data._M_elems[0xb];
      local_9e8.m_backend.data._M_elems[4] = local_da8.data._M_elems[4];
      local_9e8.m_backend.data._M_elems[5] = local_da8.data._M_elems[5];
      local_9e8.m_backend.data._M_elems[6] = local_da8.data._M_elems[6];
      local_9e8.m_backend.data._M_elems[7] = local_da8.data._M_elems[7];
      local_9e8.m_backend.data._M_elems[0] = local_da8.data._M_elems[0];
      local_9e8.m_backend.data._M_elems[1] = local_da8.data._M_elems[1];
      local_9e8.m_backend.data._M_elems[2] = local_da8.data._M_elems[2];
      local_9e8.m_backend.data._M_elems[3] = local_da8.data._M_elems[3];
      local_9e8.m_backend.exp = local_da8.exp;
      local_9e8.m_backend.neg = local_da8.neg;
      local_9e8.m_backend.fpclass = local_da8.fpclass;
      local_9e8.m_backend.prec_elem = local_da8.prec_elem;
      local_a38.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
      local_a38.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2)
      ;
      local_a38.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
      local_a38.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
      local_a38.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
      local_a38.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
      local_a38.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
      local_a38.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
      local_a38.m_backend.exp = (eps3->m_backend).exp;
      local_a38.m_backend.neg = (eps3->m_backend).neg;
      local_a38.m_backend.fpclass = (eps3->m_backend).fpclass;
      local_a38.m_backend.prec_elem = (eps3->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_9e8,&local_a38);
      uVar8 = uVar1;
      if (bVar7) {
        local_a88.m_backend.data._M_elems[0xf]._1_3_ = local_da8.data._M_elems[0xf]._1_3_;
        local_a88.m_backend.data._M_elems._56_5_ = local_da8.data._M_elems._56_5_;
        local_a88.m_backend.data._M_elems[0xc] = local_da8.data._M_elems[0xc];
        local_a88.m_backend.data._M_elems[0xd] = local_da8.data._M_elems[0xd];
        local_a88.m_backend.data._M_elems[8] = local_da8.data._M_elems[8];
        local_a88.m_backend.data._M_elems[9] = local_da8.data._M_elems[9];
        local_a88.m_backend.data._M_elems[10] = local_da8.data._M_elems[10];
        local_a88.m_backend.data._M_elems[0xb] = local_da8.data._M_elems[0xb];
        local_a88.m_backend.data._M_elems[4] = local_da8.data._M_elems[4];
        local_a88.m_backend.data._M_elems[5] = local_da8.data._M_elems[5];
        local_a88.m_backend.data._M_elems[6] = local_da8.data._M_elems[6];
        local_a88.m_backend.data._M_elems[7] = local_da8.data._M_elems[7];
        local_a88.m_backend.data._M_elems[0] = local_da8.data._M_elems[0];
        local_a88.m_backend.data._M_elems[1] = local_da8.data._M_elems[1];
        local_a88.m_backend.data._M_elems[2] = local_da8.data._M_elems[2];
        local_a88.m_backend.data._M_elems[3] = local_da8.data._M_elems[3];
        local_a88.m_backend.exp = local_da8.exp;
        local_a88.m_backend.neg = local_da8.neg;
        local_a88.m_backend.fpclass = local_da8.fpclass;
        local_a88.m_backend.prec_elem = local_da8.prec_elem;
        updateSolutionVectorLright(this,&local_a88,iVar4,vec3 + iVar4,ridx3,rn3);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright3(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2,
   R* vec3, int* ridx3, int& rn3, R eps3)
{
   int i, j, k, n;
   int end;
   R x, x2, x3;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x = vec[j];
      x2 = vec2[j];
      x3 = vec3[j];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x2, eps2))
         {
            if(isNotZero(x3, eps3))
            {
               // case 1: all three vectors are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
                  ++val;
               }
            }
            else
            {
               // case 2: 1 and 2 are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  ++val;
               }
            }
         }
         else if(isNotZero(x3, eps3))
         {
            // case 3: 1 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 4: only 1 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x3, eps3))
         {
            // case 5: 2 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 6: only 2 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
      }
      else if(isNotZero(x3, eps3))
      {
         // case 7: only 3 is nonzero at j
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
            ++val;
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2, tmp3;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx] * (*val);
            tmp3 += vec3[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);
         x3 = R(tmp3);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);

         if(isNotZero(x3, eps3))
            updateSolutionVectorLright(x3, j, vec3[j], ridx3, rn3);
      }
   }
}